

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  ColourGuard *in_stack_ffffffffffffff88;
  ColourGuard *in_stack_ffffffffffffff90;
  string *psVar3;
  string local_48 [16];
  AssertionResult *in_stack_ffffffffffffffc8;
  AssertionResult *in_stack_ffffffffffffffe8;
  
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_ffffffffffffffe8);
  if (bVar1) {
    ColourImpl::guardColour((ColourImpl *)*in_RDI,(Code)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    poVar2 = Catch::operator<<((ostream *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::operator<<(poVar2," for: ");
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff90);
    poVar2 = (ostream *)*in_RDI;
    psVar3 = local_48;
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator<<(poVar2,psVar3);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << colourImpl->guardColour(compactDimColour) << " for: ";
            stream << result.getExpandedExpression();
        }
    }